

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O0

void __thiscall crnlib::dxt_hc::dxt_hc(dxt_hc *this)

{
  crn_thread_id_t cVar1;
  vector<unsigned_long_long> *local_48;
  dxt_hc *this_local;
  
  vector<crnlib::dxt_hc::tile_details>::vector(&this->m_tiles);
  this->m_num_blocks = 0;
  vector<float>::vector(&this->m_block_weights);
  vector<unsigned_char>::vector(&this->m_block_encodings);
  local_48 = this->m_block_selectors;
  do {
    vector<unsigned_long_long>::vector(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (vector<unsigned_long_long> *)&this->m_color_selectors);
  vector<unsigned_int>::vector(&this->m_color_selectors);
  vector<unsigned_long_long>::vector(&this->m_alpha_selectors);
  vector<bool>::vector(&this->m_color_selectors_used);
  vector<bool>::vector(&this->m_alpha_selectors_used);
  vector<unsigned_int>::vector(&this->m_tile_indices);
  vector<crnlib::dxt_hc::endpoint_indices_details>::vector(&this->m_endpoint_indices);
  vector<crnlib::dxt_hc::selector_indices_details>::vector(&this->m_selector_indices);
  params::params(&this->m_params);
  this->m_num_alpha_blocks = 0;
  this->m_has_color_blocks = false;
  this->m_has_etc_color_blocks = false;
  this->m_has_subblocks = false;
  vector<crnlib::dxt_hc::color_cluster>::vector(&this->m_color_clusters);
  vector<crnlib::dxt_hc::alpha_cluster>::vector(&this->m_alpha_clusters);
  cVar1 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar1;
  this->m_canceled = false;
  this->m_pTask_pool = (task_pool *)0x0;
  this->m_prev_phase_index = -1;
  this->m_prev_percentage_complete = -1;
  return;
}

Assistant:

dxt_hc::dxt_hc() :
        m_num_blocks(0),
        m_has_color_blocks(false),
        m_has_etc_color_blocks(false),
        m_has_subblocks(false),
        m_num_alpha_blocks(0),
        m_main_thread_id(crn_get_current_thread_id()),
        m_canceled(false),
        m_pTask_pool(nullptr),
        m_prev_phase_index(-1),
        m_prev_percentage_complete(-1)
    {
    }